

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void encode_b_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
                   int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
                   PICK_MODE_CONTEXT *ctx,int *rate)

{
  uint16_t *puVar1;
  uint8_t *puVar2;
  CANDIDATE_MV *pCVar3;
  BLOCK_SIZE BVar4;
  _Bool _Var5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MB_MODE_INFO *pMVar10;
  SequenceHeader *pSVar11;
  MB_MODE_INFO *pMVar12;
  MB_MODE_INFO_EXT_FRAME *pMVar13;
  CANDIDATE_MV CVar14;
  CANDIDATE_MV CVar15;
  CANDIDATE_MV CVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  scale_factors *psVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  long lVar25;
  ulong uVar26;
  undefined4 uVar28;
  int *piVar27;
  
  uVar26 = (ulong)bsize;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  iVar7 = (td->mb).rdmult;
  uVar28 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  pMVar10 = *(td->mb).e_mbd.mi;
  pMVar10->partition = partition;
  piVar27 = (int *)CONCAT44(uVar28,(uint)dry_run);
  av1_update_state(cpi,td,ctx,mi_row,mi_col,bsize,dry_run);
  if (dry_run != '\0') {
    encode_superblock(cpi,tile_data,td,tp,'\x01',bsize,piVar27);
    goto LAB_001e3cf4;
  }
  pSVar11 = (cpi->common).seq_params;
  iVar8 = pSVar11->subsampling_x;
  iVar9 = pSVar11->subsampling_y;
  *(undefined4 *)((td->mb).mbmi_ext_frame)->cb_offset = *(undefined4 *)(td->mb).cb_offset;
  encode_superblock(cpi,tile_data,td,tp,'\0',bsize,piVar27);
  puVar1 = (td->mb).cb_offset;
  *puVar1 = *puVar1 + (ushort)block_size_high[uVar26] * (ushort)block_size_wide[uVar26];
  if ((td->mb).e_mbd.is_chroma_ref == true) {
    BVar4 = av1_ss_size_lookup[uVar26][iVar8][iVar9];
    puVar1 = (td->mb).cb_offset + 1;
    *puVar1 = *puVar1 + (ushort)block_size_high[BVar4] * (ushort)block_size_wide[BVar4];
  }
  uVar6 = *(ushort *)&pMVar10->field_0xa7;
  uVar20 = (uint)uVar6;
  if ('\0' < pMVar10->ref_frame[1]) {
    if (((uVar6 >> 9 & 1) == 0) || ((pMVar10->interinter_comp).type == '\0')) {
      uVar20 = uVar6 & 0xfeff;
    }
    else {
      uVar20 = uVar6 | 0x100;
    }
    uVar20 = uVar20 | 0x200;
    *(short *)&pMVar10->field_0xa7 = (short)uVar20;
  }
  if ((uVar20 & 0x40) == 0) {
    if ((((cpi->common).seg.enabled == '\0') ||
        (((cpi->common).seg.feature_mask[uVar20 & 7] & 0x20) == 0)) &&
       (((char)uVar20 < '\0' || ('\0' < pMVar10->ref_frame[0])))) {
      (td->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      _Var5 = (td->mb).e_mbd.left_available;
      if ((td->mb).e_mbd.up_available == true) {
        pMVar12 = (td->mb).e_mbd.above_mbmi;
        if ((pMVar12->field_0xa7 & 0x80) != 0 || '\0' < pMVar12->ref_frame[0]) {
          puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[0];
          *puVar2 = *puVar2 + '\x01';
          if (0 < (long)pMVar12->ref_frame[1]) {
            puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[1];
            *puVar2 = *puVar2 + '\x01';
          }
        }
      }
      if (_Var5 != false) {
        pMVar12 = (td->mb).e_mbd.left_mbmi;
        if ((pMVar12->field_0xa7 & 0x80) != 0 || '\0' < pMVar12->ref_frame[0]) {
          puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[0];
          *puVar2 = *puVar2 + '\x01';
          if (0 < (long)pMVar12->ref_frame[1]) {
            puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[1];
            *puVar2 = *puVar2 + '\x01';
          }
        }
      }
      goto LAB_001e3bf6;
    }
  }
  else {
    (td->rd_counts).skip_mode_used_flag = 1;
LAB_001e3bf6:
    if ((cpi->common).current_frame.reference_mode == '\x02') {
      bVar24 = pMVar10->ref_frame[1];
      if ('\0' < (char)bVar24) {
        (td->rd_counts).compound_ref_used_flag = 1;
        goto LAB_001e3c11;
      }
    }
    else {
LAB_001e3c11:
      bVar24 = pMVar10->ref_frame[1];
    }
    bVar22 = pMVar10->ref_frame[0];
    if ((char)bVar22 < '\t') {
      bVar23 = 1;
      if ('\x01' < (char)bVar22) {
        bVar23 = bVar22;
      }
      iVar8 = (cpi->common).remapped_ref_idx[bVar23 - 1];
      if (iVar8 == -1) goto LAB_001e3c55;
      psVar21 = (cpi->common).ref_scale_factors + iVar8;
    }
    else {
LAB_001e3c55:
      psVar21 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar21;
    if ((char)bVar24 < '\t') {
      bVar22 = 1;
      if ('\x01' < (char)bVar24) {
        bVar22 = bVar24;
      }
      iVar8 = (cpi->common).remapped_ref_idx[bVar22 - 1];
      if (iVar8 == -1) goto LAB_001e3c93;
      psVar21 = (cpi->common).ref_scale_factors + iVar8;
    }
    else {
LAB_001e3c93:
      psVar21 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar21;
  }
  if (((cpi->oxcf).algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY) &&
     (pMVar10->mode == 0x10 || pMVar10->mode < 0xd)) {
    piVar27 = &(td->rd_counts).newmv_or_intra_blocks;
    *piVar27 = *piVar27 +
               (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar26] *
               (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar26];
  }
  if (tile_data->allow_update_cdf != '\0') {
    update_stats(&cpi->common,td);
  }
LAB_001e3cf4:
  if (((((cpi->oxcf).q_cfg.aq_mode == '\x03') || ((cpi->active_map).enabled != 0)) &&
      (pMVar10->skip_txfm != '\0')) &&
     (((cpi->rc).rtc_external_ratectrl == 0 && ((cpi->common).seg.enabled != '\0')))) {
    av1_cyclic_reset_segment_skip(cpi,&td->mb,mi_row,mi_col,bsize,dry_run);
  }
  pMVar13 = (td->mb).mbmi_ext_frame;
  pMVar10 = *(td->mb).e_mbd.mi;
  bVar24 = pMVar10->ref_frame[0];
  bVar22 = pMVar10->ref_frame[1];
  if ('\0' < (char)bVar22) {
    if (bVar22 < 5 || '\x04' < (char)bVar24) {
      lVar25 = 0;
      do {
        if ((bVar24 == (&comp_ref0_lut)[lVar25]) && (bVar22 == (&comp_ref1_lut)[lVar25])) {
          bVar24 = (char)lVar25 + 0x14;
          goto LAB_001e3d9e;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 9);
    }
    bVar24 = (bVar22 * '\x04' + bVar24) - 0xd;
  }
LAB_001e3d9e:
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar24];
  CVar14 = *pCVar3;
  CVar15 = pCVar3[1];
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar24] + 2;
  CVar16 = pCVar3[1];
  pMVar13->ref_mv_stack[2] = *pCVar3;
  pMVar13->ref_mv_stack[3] = CVar16;
  pMVar13->ref_mv_stack[0] = CVar14;
  pMVar13->ref_mv_stack[1] = CVar15;
  *&pMVar13->weight = (td->mb).mbmi_ext.weight[bVar24];
  pMVar13->mode_context = (td->mb).mbmi_ext.mode_context[bVar24];
  pMVar13->ref_mv_count = (td->mb).mbmi_ext.ref_mv_count[bVar24];
  uVar17 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2);
  uVar18 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4);
  uVar19 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6);
  *(undefined8 *)pMVar13->global_mvs = *(undefined8 *)(td->mb).mbmi_ext.global_mvs;
  *(undefined8 *)(pMVar13->global_mvs + 2) = uVar17;
  *(undefined8 *)(pMVar13->global_mvs + 4) = uVar18;
  *(undefined8 *)(pMVar13->global_mvs + 6) = uVar19;
  (td->mb).rdmult = iVar7;
  return;
}

Assistant:

static void encode_b_nonrd(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                           ThreadData *td, TokenExtra **tp, int mi_row,
                           int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                           PARTITION_TYPE partition,
                           PICK_MODE_CONTEXT *const ctx, int *rate) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);
  const int subsampling_x = cpi->common.seq_params->subsampling_x;
  const int subsampling_y = cpi->common.seq_params->subsampling_y;
  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);
  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
      mbmi->compound_idx = 1;
    }
    RD_COUNTS *const rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
          has_second_ref(mbmi)) {
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
              has_second_ref(mbmi)) {
            // This flag is also updated for 4x4 blocks
            rdc->compound_ref_used_flag = 1;
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        (mbmi->mode == NEWMV || mbmi->mode < INTRA_MODE_END)) {
      int32_t blocks = mi_size_high[bsize] * mi_size_wide[bsize];
      rdc->newmv_or_intra_blocks += blocks;
    }
    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);
  }
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ ||
       cpi->active_map.enabled) &&
      mbmi->skip_txfm && !cpi->rc.rtc_external_ratectrl && cm->seg.enabled)
    av1_cyclic_reset_segment_skip(cpi, x, mi_row, mi_col, bsize, dry_run);
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
}